

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_K256_ECDSA.c
# Opt level: O2

void Hacl_Impl_K256_PointMul_point_mul(uint64_t *out,uint64_t *scalar,uint64_t *q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint64_t uVar87;
  uint64_t uVar88;
  uint64_t uVar89;
  uint64_t uVar90;
  uint64_t uVar91;
  uint64_t uVar92;
  uint64_t uVar93;
  uint64_t uVar94;
  uint64_t uVar95;
  uint64_t uVar96;
  uint64_t uVar97;
  uint64_t uVar98;
  uint64_t uVar99;
  uint64_t uVar100;
  uint64_t uVar101;
  long lVar102;
  long lVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  uint32_t i;
  uint64_t *t11_1;
  uint64_t *puVar112;
  undefined8 *puVar113;
  uint64_t *puVar114;
  undefined8 *puVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  ulong uVar122;
  uint64_t *t11;
  ulong uVar123;
  ulong uVar124;
  byte bVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 local_e48 [16];
  undefined1 local_e38 [16];
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  ulong local_de8;
  ulong local_de0;
  ulong local_dd8;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  uint64_t local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  uint64_t local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  uint64_t local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  uint64_t local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  uint64_t local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  uint64_t local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  uint64_t local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  uint64_t local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  uint64_t local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  uint64_t local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  uint64_t local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  uint64_t local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  uint64_t local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  uint64_t local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  uint64_t local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  uint64_t local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  ulong local_750;
  ulong local_748;
  ulong local_740;
  uint64_t local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  uint64_t local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  ulong local_660;
  ulong local_658;
  ulong local_650;
  uint64_t local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  ulong local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  uint64_t local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  ulong local_570;
  ulong local_568;
  ulong local_560;
  uint64_t local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong local_4e8;
  uint64_t local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  uint64_t local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong local_408;
  ulong local_400;
  ulong local_3f8;
  uint64_t local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  uint64_t local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  uint64_t local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  uint64_t local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  uint64_t local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  uint64_t local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  uint64_t local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uint64_t tmp [15];
  
  bVar125 = 0;
  memset(&local_738,0,0x690);
  tmp[0xc] = 0;
  tmp[0xd] = 0;
  tmp[10] = 0;
  tmp[0xb] = 0;
  tmp[8] = 0;
  tmp[9] = 0;
  tmp[6] = 0;
  tmp[7] = 0;
  tmp[4] = 0;
  tmp[5] = 0;
  tmp[0xe] = 0;
  tmp[2] = 0;
  tmp[3] = 0;
  tmp[0] = 0;
  tmp[1] = 0;
  local_808 = 0;
  local_828 = 0;
  uStack_820 = 0;
  local_818 = 0;
  uStack_810 = 0;
  local_7f8 = 0;
  uStack_7f0 = 0;
  local_7e8 = 0;
  uStack_7e0 = 0;
  uStack_800 = 1;
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7b8 = 0;
  lVar103 = 0xf;
  puVar112 = q;
  puVar114 = &local_7b0;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_7b0);
  puVar112 = tmp;
  puVar114 = &local_738;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_738);
  puVar112 = tmp;
  puVar114 = &local_6c0;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_738);
  puVar112 = tmp;
  puVar114 = &local_648;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_648);
  puVar112 = tmp;
  puVar114 = &local_5d0;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_6c0);
  puVar112 = tmp;
  puVar114 = &local_558;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_558);
  puVar112 = tmp;
  puVar114 = &local_4e0;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_648);
  puVar112 = tmp;
  puVar114 = &local_468;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_468);
  puVar112 = tmp;
  puVar114 = &local_3f0;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_5d0);
  puVar112 = tmp;
  puVar114 = &local_378;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_378);
  puVar112 = tmp;
  puVar114 = &local_300;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_558);
  puVar112 = tmp;
  puVar114 = &local_288;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_288);
  puVar112 = tmp;
  puVar114 = &local_210;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(tmp,&local_4e0);
  puVar112 = tmp;
  puVar114 = &local_198;
  for (lVar102 = lVar103; lVar102 != 0; lVar102 = lVar102 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(tmp,q,&local_198);
  puVar112 = tmp;
  puVar114 = &local_120;
  for (; lVar103 != 0; lVar103 = lVar103 + -1) {
    *puVar114 = *puVar112;
    puVar112 = puVar112 + (ulong)bVar125 * -2 + 1;
    puVar114 = puVar114 + (ulong)bVar125 * -2 + 1;
  }
  out[4] = 0;
  out[5] = 0;
  out[8] = 0;
  out[9] = 0;
  out[6] = 0;
  out[7] = 0;
  out[2] = 0;
  out[3] = 0;
  *out = 0;
  out[1] = 0;
  out[5] = 1;
  out[10] = 0;
  out[0xb] = 0;
  out[0xc] = 0;
  out[0xd] = 0;
  out[0xe] = 0;
  local_838 = local_7b0;
  uStack_830 = uStack_7a8;
  local_848 = local_7a0;
  uStack_840 = uStack_798;
  local_858 = local_790;
  uStack_850 = uStack_788;
  local_868 = local_780;
  uStack_860 = uStack_778;
  local_878 = local_760;
  uStack_870 = uStack_758;
  local_888 = local_770;
  uStack_880 = uStack_768;
  local_898 = local_728;
  uStack_890 = uStack_720;
  local_8a8 = local_738;
  uStack_8a0 = uStack_730;
  local_8b8 = local_708;
  uStack_8b0 = uStack_700;
  local_8c8 = local_718;
  uStack_8c0 = uStack_710;
  local_8d8 = local_6e8;
  uStack_8d0 = uStack_6e0;
  local_8e8 = local_6f8;
  uStack_8e0 = uStack_6f0;
  local_8f8 = local_6b0;
  uStack_8f0 = uStack_6a8;
  local_908 = local_6c0;
  uStack_900 = uStack_6b8;
  local_918 = local_690;
  uStack_910 = uStack_688;
  local_928 = local_6a0;
  uStack_920 = uStack_698;
  local_938 = local_670;
  uStack_930 = uStack_668;
  local_948 = local_680;
  uStack_940 = uStack_678;
  local_958 = local_638;
  uStack_950 = uStack_630;
  local_968 = local_648;
  uStack_960 = uStack_640;
  local_978 = local_618;
  uStack_970 = uStack_610;
  local_988 = local_628;
  uStack_980 = uStack_620;
  local_998 = local_5f8;
  uStack_990 = uStack_5f0;
  local_9a8 = local_608;
  uStack_9a0 = uStack_600;
  local_9b8 = local_580;
  uStack_9b0 = uStack_578;
  local_9c8 = local_590;
  uStack_9c0 = uStack_588;
  local_9d8 = local_5c0;
  uStack_9d0 = uStack_5b8;
  local_9e8 = local_5d0;
  uStack_9e0 = uStack_5c8;
  local_9f8 = local_5a0;
  uStack_9f0 = uStack_598;
  local_a08 = local_5b0;
  uStack_a00 = uStack_5a8;
  local_a18 = local_548;
  uStack_a10 = uStack_540;
  local_a28 = local_558;
  uStack_a20 = uStack_550;
  local_a38 = local_528;
  uStack_a30 = uStack_520;
  local_a48 = local_538;
  uStack_a40 = uStack_530;
  local_a58 = local_518;
  uStack_a50 = uStack_510;
  local_a68 = local_508;
  uStack_a60 = uStack_500;
  local_a78 = local_368;
  uStack_a70 = uStack_360;
  local_a88 = local_378;
  uStack_a80 = uStack_370;
  local_a98 = local_348;
  uStack_a90 = uStack_340;
  local_aa8 = local_358;
  uStack_aa0 = uStack_350;
  local_ab8 = local_328;
  uStack_ab0 = uStack_320;
  local_ac8 = local_338;
  uStack_ac0 = uStack_330;
  local_ad8 = local_4d0;
  uStack_ad0 = uStack_4c8;
  local_ae8 = local_4e0;
  uStack_ae0 = uStack_4d8;
  local_af8 = local_4b0;
  uStack_af0 = uStack_4a8;
  local_b08 = local_4c0;
  uStack_b00 = uStack_4b8;
  local_b18 = local_490;
  uStack_b10 = uStack_488;
  local_b28 = local_4a0;
  uStack_b20 = uStack_498;
  local_b38 = local_458;
  uStack_b30 = uStack_450;
  local_b48 = local_468;
  uStack_b40 = uStack_460;
  local_b58 = local_438;
  uStack_b50 = uStack_430;
  local_b68 = local_448;
  uStack_b60 = uStack_440;
  local_b78 = local_418;
  uStack_b70 = uStack_410;
  local_b88 = local_428;
  uStack_b80 = uStack_420;
  local_b98 = local_3e0;
  uStack_b90 = uStack_3d8;
  local_ba8 = local_3f0;
  uStack_ba0 = uStack_3e8;
  local_bb8 = local_3c0;
  uStack_bb0 = uStack_3b8;
  local_bc8 = local_3d0;
  uStack_bc0 = uStack_3c8;
  local_bd8 = local_3a0;
  uStack_bd0 = uStack_398;
  local_be8 = local_3b0;
  uStack_be0 = uStack_3a8;
  local_bf8 = local_2f0;
  uStack_bf0 = uStack_2e8;
  local_c08 = local_300;
  uStack_c00 = uStack_2f8;
  local_c18 = local_2d0;
  uStack_c10 = uStack_2c8;
  local_c28 = local_2e0;
  uStack_c20 = uStack_2d8;
  local_c38 = local_2b0;
  uStack_c30 = uStack_2a8;
  local_c48 = local_2c0;
  uStack_c40 = uStack_2b8;
  local_c58 = local_278;
  uStack_c50 = uStack_270;
  local_c68 = local_288;
  uStack_c60 = uStack_280;
  local_c78 = local_258;
  uStack_c70 = uStack_250;
  local_c88 = local_268;
  uStack_c80 = uStack_260;
  local_c98 = local_238;
  uStack_c90 = uStack_230;
  local_ca8 = local_248;
  uStack_ca0 = uStack_240;
  local_cb8 = local_200;
  uStack_cb0 = uStack_1f8;
  local_cc8 = local_210;
  uStack_cc0 = uStack_208;
  local_cd8 = local_1e0;
  uStack_cd0 = uStack_1d8;
  local_ce8 = local_1f0;
  uStack_ce0 = uStack_1e8;
  local_cf8 = local_1c0;
  uStack_cf0 = uStack_1b8;
  local_d08 = local_1d0;
  uStack_d00 = uStack_1c8;
  local_d18 = local_188;
  uStack_d10 = uStack_180;
  local_d28 = local_198;
  uStack_d20 = uStack_190;
  local_d38 = local_110;
  uStack_d30 = uStack_108;
  local_d48 = local_120;
  uStack_d40 = uStack_118;
  local_d58 = local_168;
  uStack_d50 = uStack_160;
  local_d68 = local_178;
  uStack_d60 = uStack_170;
  local_d78 = local_f0;
  uStack_d70 = uStack_e8;
  local_d88 = local_100;
  uStack_d80 = uStack_f8;
  local_d98 = local_148;
  uStack_d90 = uStack_140;
  local_da8 = local_158;
  uStack_da0 = uStack_150;
  local_db8 = local_d0;
  uStack_db0 = uStack_c8;
  local_dc8 = local_e0;
  uStack_dc0 = uStack_d8;
  for (i = 0xfc; i != 0xfffffffc; i = i - 4) {
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    uVar87 = Hacl_Bignum_Lib_bn_get_bits_u64(4,scalar,i,4);
    puVar113 = &local_828;
    puVar115 = (undefined8 *)local_e48;
    for (lVar103 = 0xf; lVar103 != 0; lVar103 = lVar103 + -1) {
      *puVar115 = *puVar113;
      puVar113 = puVar113 + (ulong)bVar125 * -2 + 1;
      puVar115 = puVar115 + (ulong)bVar125 * -2 + 1;
    }
    uVar88 = FStar_UInt64_eq_mask(uVar87,1);
    uVar104 = ~uVar88;
    uVar120 = local_de8 & uVar104;
    uVar111 = local_de0 & uVar104;
    uVar119 = local_dd8 & uVar104;
    uVar89 = FStar_UInt64_eq_mask(uVar87,2);
    uVar123 = ~uVar89;
    uVar90 = FStar_UInt64_eq_mask(uVar87,3);
    uVar116 = ~uVar90;
    uVar91 = FStar_UInt64_eq_mask(uVar87,4);
    uVar121 = ~uVar91;
    auVar126._8_4_ = (int)uVar88;
    auVar126._0_8_ = uVar88;
    auVar126._12_4_ = (int)(uVar88 >> 0x20);
    auVar85._8_8_ = uStack_840;
    auVar85._0_8_ = local_848;
    auVar86._8_8_ = uStack_830;
    auVar86._0_8_ = local_838;
    auVar157._8_4_ = (int)uVar104;
    auVar157._0_8_ = uVar104;
    auVar157._12_4_ = (int)(uVar104 >> 0x20);
    auVar134 = local_e38 & auVar157;
    auVar152 = local_e48 & auVar157;
    auVar128._8_4_ = (int)uVar89;
    auVar128._0_8_ = uVar89;
    auVar128._12_4_ = (int)(uVar89 >> 0x20);
    auVar80._8_8_ = uStack_890;
    auVar80._0_8_ = local_898;
    auVar79._8_8_ = uStack_8a0;
    auVar79._0_8_ = local_8a8;
    auVar138._8_4_ = (int)uVar123;
    auVar138._0_8_ = uVar123;
    auVar138._12_4_ = (int)(uVar123 >> 0x20);
    auVar131._8_4_ = (int)uVar90;
    auVar131._0_8_ = uVar90;
    auVar131._12_4_ = (int)(uVar90 >> 0x20);
    auVar74._8_8_ = uStack_8f0;
    auVar74._0_8_ = local_8f8;
    auVar73._8_8_ = uStack_900;
    auVar73._0_8_ = local_908;
    auVar141._8_4_ = (int)uVar116;
    auVar141._0_8_ = uVar116;
    auVar141._12_4_ = (int)(uVar116 >> 0x20);
    auVar135._8_4_ = (int)uVar91;
    auVar135._0_8_ = uVar91;
    auVar135._12_4_ = (int)(uVar91 >> 0x20);
    auVar68._8_8_ = uStack_950;
    auVar68._0_8_ = local_958;
    auVar67._8_8_ = uStack_960;
    auVar67._0_8_ = local_968;
    auVar144._8_4_ = (int)uVar121;
    auVar144._0_8_ = uVar121;
    auVar144._12_4_ = (int)(uVar121 >> 0x20);
    auVar83._8_8_ = uStack_860;
    auVar83._0_8_ = local_868;
    auVar84._8_8_ = uStack_850;
    auVar84._0_8_ = local_858;
    auVar153 = local_e18 & auVar157;
    auVar155 = local_e28 & auVar157;
    auVar78._8_8_ = uStack_8b0;
    auVar78._0_8_ = local_8b8;
    auVar77._8_8_ = uStack_8c0;
    auVar77._0_8_ = local_8c8;
    auVar72._8_8_ = uStack_910;
    auVar72._0_8_ = local_918;
    auVar71._8_8_ = uStack_920;
    auVar71._0_8_ = local_928;
    auVar66._8_8_ = uStack_970;
    auVar66._0_8_ = local_978;
    auVar65._8_8_ = uStack_980;
    auVar65._0_8_ = local_988;
    auVar82._8_8_ = uStack_870;
    auVar82._0_8_ = local_878;
    auVar149 = local_df8 & auVar157;
    auVar81._8_8_ = uStack_880;
    auVar81._0_8_ = local_888;
    auVar157 = auVar157 & local_e08;
    auVar76._8_8_ = uStack_8d0;
    auVar76._0_8_ = local_8d8;
    auVar75._8_8_ = uStack_8e0;
    auVar75._0_8_ = local_8e8;
    auVar70._8_8_ = uStack_930;
    auVar70._0_8_ = local_938;
    auVar69._8_8_ = uStack_940;
    auVar69._0_8_ = local_948;
    auVar64._8_8_ = uStack_990;
    auVar64._0_8_ = local_998;
    auVar63._8_8_ = uStack_9a0;
    auVar63._0_8_ = local_9a8;
    uVar92 = FStar_UInt64_eq_mask(uVar87,5);
    uVar104 = ~uVar92;
    uVar93 = FStar_UInt64_eq_mask(uVar87,6);
    uVar105 = ~uVar93;
    uVar94 = FStar_UInt64_eq_mask(uVar87,7);
    uVar106 = ~uVar94;
    uVar95 = FStar_UInt64_eq_mask(uVar87,8);
    uVar117 = ~uVar95;
    uVar96 = FStar_UInt64_eq_mask(uVar87,9);
    uVar107 = ~uVar96;
    uVar97 = FStar_UInt64_eq_mask(uVar87,10);
    uVar124 = ~uVar97;
    auVar159._8_4_ = (int)uVar97;
    auVar159._0_8_ = uVar97;
    auVar159._12_4_ = (int)(uVar97 >> 0x20);
    auVar50._8_8_ = uStack_a70;
    auVar50._0_8_ = local_a78;
    auVar150._8_4_ = (int)uVar92;
    auVar150._0_8_ = uVar92;
    auVar150._12_4_ = (int)(uVar92 >> 0x20);
    auVar60._8_8_ = uStack_9d0;
    auVar60._0_8_ = local_9d8;
    auVar59._8_8_ = uStack_9e0;
    auVar59._0_8_ = local_9e8;
    auVar158._8_4_ = (int)uVar104;
    auVar158._0_8_ = uVar104;
    auVar158._12_4_ = (int)(uVar104 >> 0x20);
    auVar142._8_4_ = (int)uVar93;
    auVar142._0_8_ = uVar93;
    auVar142._12_4_ = (int)(uVar93 >> 0x20);
    auVar56._8_8_ = uStack_a10;
    auVar56._0_8_ = local_a18;
    auVar55._8_8_ = uStack_a20;
    auVar55._0_8_ = local_a28;
    auVar156._8_4_ = (int)uVar105;
    auVar156._0_8_ = uVar105;
    auVar156._12_4_ = (int)(uVar105 >> 0x20);
    auVar136._8_4_ = (int)uVar94;
    auVar136._0_8_ = uVar94;
    auVar136._12_4_ = (int)(uVar94 >> 0x20);
    auVar44._8_8_ = uStack_ad0;
    auVar44._0_8_ = local_ad8;
    auVar43._8_8_ = uStack_ae0;
    auVar43._0_8_ = local_ae8;
    auVar147._8_4_ = (int)uVar106;
    auVar147._0_8_ = uVar106;
    auVar147._12_4_ = (int)(uVar106 >> 0x20);
    auVar132._8_4_ = (int)uVar95;
    auVar132._0_8_ = uVar95;
    auVar132._12_4_ = (int)(uVar95 >> 0x20);
    auVar38._8_8_ = uStack_b30;
    auVar38._0_8_ = local_b38;
    auVar37._8_8_ = uStack_b40;
    auVar37._0_8_ = local_b48;
    auVar160._8_4_ = (int)uVar117;
    auVar160._0_8_ = uVar117;
    auVar160._12_4_ = (int)(uVar117 >> 0x20);
    auVar129._8_4_ = (int)uVar96;
    auVar129._0_8_ = uVar96;
    auVar129._12_4_ = (int)(uVar96 >> 0x20);
    auVar32._8_8_ = uStack_b90;
    auVar32._0_8_ = local_b98;
    auVar139._8_4_ = (int)uVar107;
    auVar139._0_8_ = uVar107;
    auVar139._12_4_ = (int)(uVar107 >> 0x20);
    auVar31._8_8_ = uStack_ba0;
    auVar31._0_8_ = local_ba8;
    auVar145._8_4_ = (int)uVar124;
    auVar145._0_8_ = uVar124;
    auVar145._12_4_ = (int)(uVar124 >> 0x20);
    auVar49._8_8_ = uStack_a80;
    auVar49._0_8_ = local_a88;
    auVar58._8_8_ = uStack_9f0;
    auVar58._0_8_ = local_9f8;
    auVar57._8_8_ = uStack_a00;
    auVar57._0_8_ = local_a08;
    auVar54._8_8_ = uStack_a30;
    auVar54._0_8_ = local_a38;
    auVar53._8_8_ = uStack_a40;
    auVar53._0_8_ = local_a48;
    auVar42._8_8_ = uStack_af0;
    auVar42._0_8_ = local_af8;
    auVar41._8_8_ = uStack_b00;
    auVar41._0_8_ = local_b08;
    auVar36._8_8_ = uStack_b50;
    auVar36._0_8_ = local_b58;
    auVar35._8_8_ = uStack_b60;
    auVar35._0_8_ = local_b68;
    auVar30._8_8_ = uStack_bb0;
    auVar30._0_8_ = local_bb8;
    auVar29._8_8_ = uStack_bc0;
    auVar29._0_8_ = local_bc8;
    auVar48._8_8_ = uStack_a90;
    auVar48._0_8_ = local_a98;
    auVar47._8_8_ = uStack_aa0;
    auVar47._0_8_ = local_aa8;
    auVar62._8_8_ = uStack_9b0;
    auVar62._0_8_ = local_9b8;
    auVar61._8_8_ = uStack_9c0;
    auVar61._0_8_ = local_9c8;
    auVar51._8_8_ = uStack_a60;
    auVar51._0_8_ = local_a68;
    auVar52._8_8_ = uStack_a50;
    auVar52._0_8_ = local_a58;
    auVar40._8_8_ = uStack_b10;
    auVar40._0_8_ = local_b18;
    auVar39._8_8_ = uStack_b20;
    auVar39._0_8_ = local_b28;
    auVar34._8_8_ = uStack_b70;
    auVar34._0_8_ = local_b78;
    auVar33._8_8_ = uStack_b80;
    auVar33._0_8_ = local_b88;
    auVar28._8_8_ = uStack_bd0;
    auVar28._0_8_ = local_bd8;
    auVar27._8_8_ = uStack_be0;
    auVar27._0_8_ = local_be8;
    auVar46._8_8_ = uStack_ab0;
    auVar46._0_8_ = local_ab8;
    auVar45._8_8_ = uStack_ac0;
    auVar45._0_8_ = local_ac8;
    uVar98 = FStar_UInt64_eq_mask(uVar87,0xb);
    uVar108 = ~uVar98;
    uVar99 = FStar_UInt64_eq_mask(uVar87,0xc);
    uVar122 = ~uVar99;
    uVar100 = FStar_UInt64_eq_mask(uVar87,0xd);
    uVar118 = ~uVar100;
    uVar101 = FStar_UInt64_eq_mask(uVar87,0xe);
    uVar109 = ~uVar101;
    uVar87 = FStar_UInt64_eq_mask(uVar87,0xf);
    uVar110 = ~uVar87;
    auVar143._8_4_ = (int)uVar98;
    auVar143._0_8_ = uVar98;
    auVar143._12_4_ = (int)(uVar98 >> 0x20);
    auVar26._8_8_ = uStack_bf0;
    auVar26._0_8_ = local_bf8;
    auVar25._8_8_ = uStack_c00;
    auVar25._0_8_ = local_c08;
    auVar154._8_4_ = (int)uVar108;
    auVar154._0_8_ = uVar108;
    auVar154._12_4_ = (int)(uVar108 >> 0x20);
    auVar137._8_4_ = (int)uVar99;
    auVar137._0_8_ = uVar99;
    auVar137._12_4_ = (int)(uVar99 >> 0x20);
    auVar20._8_8_ = uStack_c50;
    auVar20._0_8_ = local_c58;
    auVar19._8_8_ = uStack_c60;
    auVar19._0_8_ = local_c68;
    auVar151._8_4_ = (int)uVar122;
    auVar151._0_8_ = uVar122;
    auVar151._12_4_ = (int)(uVar122 >> 0x20);
    auVar130._8_4_ = (int)uVar100;
    auVar130._0_8_ = uVar100;
    auVar130._12_4_ = (int)(uVar100 >> 0x20);
    auVar14._8_8_ = uStack_cb0;
    auVar14._0_8_ = local_cb8;
    auVar13._8_8_ = uStack_cc0;
    auVar13._0_8_ = local_cc8;
    auVar146._8_4_ = (int)uVar118;
    auVar146._0_8_ = uVar118;
    auVar146._12_4_ = (int)(uVar118 >> 0x20);
    auVar127._8_4_ = (int)uVar101;
    auVar127._0_8_ = uVar101;
    auVar127._12_4_ = (int)(uVar101 >> 0x20);
    auVar8._8_8_ = uStack_d10;
    auVar8._0_8_ = local_d18;
    auVar7._8_8_ = uStack_d20;
    auVar7._0_8_ = local_d28;
    auVar140._8_4_ = (int)uVar109;
    auVar140._0_8_ = uVar109;
    auVar140._12_4_ = (int)(uVar109 >> 0x20);
    auVar133._8_4_ = (int)uVar87;
    auVar133._0_8_ = uVar87;
    auVar133._12_4_ = (int)(uVar87 >> 0x20);
    auVar6._8_8_ = uStack_d30;
    auVar6._0_8_ = local_d38;
    auVar148._8_4_ = (int)uVar110;
    auVar148._0_8_ = uVar110;
    auVar148._12_4_ = (int)(uVar110 >> 0x20);
    local_e38 = ((((((((((((((auVar134 | auVar85 & auVar126) & auVar138 | auVar80 & auVar128) &
                            auVar141 | auVar74 & auVar131) & auVar144 | auVar68 & auVar135) &
                          auVar158 | auVar60 & auVar150) & auVar156 | auVar56 & auVar142) & auVar147
                       | auVar44 & auVar136) & auVar160 | auVar38 & auVar132) & auVar139 |
                     auVar32 & auVar129) & auVar145 | auVar50 & auVar159) & auVar154 |
                   auVar26 & auVar143) & auVar151 | auVar20 & auVar137) & auVar146 |
                 auVar14 & auVar130) & auVar140 | auVar8 & auVar127) & auVar148 | auVar6 & auVar133;
    auVar5._8_8_ = uStack_d40;
    auVar5._0_8_ = local_d48;
    local_e48 = ((((((((((((((auVar152 | auVar86 & auVar126) & auVar138 | auVar79 & auVar128) &
                            auVar141 | auVar73 & auVar131) & auVar144 | auVar67 & auVar135) &
                          auVar158 | auVar59 & auVar150) & auVar156 | auVar55 & auVar142) & auVar147
                       | auVar43 & auVar136) & auVar160 | auVar37 & auVar132) & auVar139 |
                     auVar31 & auVar129) & auVar145 | auVar49 & auVar159) & auVar154 |
                   auVar25 & auVar143) & auVar151 | auVar19 & auVar137) & auVar146 |
                 auVar13 & auVar130) & auVar140 | auVar7 & auVar127) & auVar148 | auVar5 & auVar133;
    auVar24._8_8_ = uStack_c10;
    auVar24._0_8_ = local_c18;
    auVar23._8_8_ = uStack_c20;
    auVar23._0_8_ = local_c28;
    auVar18._8_8_ = uStack_c70;
    auVar18._0_8_ = local_c78;
    auVar17._8_8_ = uStack_c80;
    auVar17._0_8_ = local_c88;
    auVar12._8_8_ = uStack_cd0;
    auVar12._0_8_ = local_cd8;
    auVar11._8_8_ = uStack_ce0;
    auVar11._0_8_ = local_ce8;
    auVar4._8_8_ = uStack_d50;
    auVar4._0_8_ = local_d58;
    auVar3._8_8_ = uStack_d60;
    auVar3._0_8_ = local_d68;
    auVar2._8_8_ = uStack_d70;
    auVar2._0_8_ = local_d78;
    local_e18 = ((((((((((((((auVar153 | auVar83 & auVar126) & auVar138 | auVar78 & auVar128) &
                            auVar141 | auVar72 & auVar131) & auVar144 | auVar66 & auVar135) &
                          auVar158 | auVar58 & auVar150) & auVar156 | auVar54 & auVar142) & auVar147
                       | auVar42 & auVar136) & auVar160 | auVar36 & auVar132) & auVar139 |
                     auVar30 & auVar129) & auVar145 | auVar48 & auVar159) & auVar154 |
                   auVar24 & auVar143) & auVar151 | auVar18 & auVar137) & auVar146 |
                 auVar12 & auVar130) & auVar140 | auVar4 & auVar127) & auVar148 | auVar2 & auVar133;
    auVar1._8_8_ = uStack_d80;
    auVar1._0_8_ = local_d88;
    local_e28 = ((((((((((((((auVar155 | auVar84 & auVar126) & auVar138 | auVar77 & auVar128) &
                            auVar141 | auVar71 & auVar131) & auVar144 | auVar65 & auVar135) &
                          auVar158 | auVar57 & auVar150) & auVar156 | auVar53 & auVar142) & auVar147
                       | auVar41 & auVar136) & auVar160 | auVar35 & auVar132) & auVar139 |
                     auVar29 & auVar129) & auVar145 | auVar47 & auVar159) & auVar154 |
                   auVar23 & auVar143) & auVar151 | auVar17 & auVar137) & auVar146 |
                 auVar11 & auVar130) & auVar140 | auVar3 & auVar127) & auVar148 | auVar1 & auVar133;
    auVar22._8_8_ = uStack_c30;
    auVar22._0_8_ = local_c38;
    auVar21._8_8_ = uStack_c40;
    auVar21._0_8_ = local_c48;
    auVar16._8_8_ = uStack_c90;
    auVar16._0_8_ = local_c98;
    auVar15._8_8_ = uStack_ca0;
    auVar15._0_8_ = local_ca8;
    auVar10._8_8_ = uStack_cf0;
    auVar10._0_8_ = local_cf8;
    auVar9._8_8_ = uStack_d00;
    auVar9._0_8_ = local_d08;
    auVar155._8_8_ = uStack_d90;
    auVar155._0_8_ = local_d98;
    auVar153._8_8_ = uStack_da0;
    auVar153._0_8_ = local_da8;
    auVar152._8_8_ = uStack_db0;
    auVar152._0_8_ = local_db8;
    local_df8 = ((((((((((((((auVar149 | auVar82 & auVar126) & auVar138 | auVar76 & auVar128) &
                            auVar141 | auVar70 & auVar131) & auVar144 | auVar64 & auVar135) &
                          auVar158 | auVar62 & auVar150) & auVar156 | auVar51 & auVar142) & auVar147
                       | auVar40 & auVar136) & auVar160 | auVar34 & auVar132) & auVar139 |
                     auVar28 & auVar129) & auVar145 | auVar46 & auVar159) & auVar154 |
                   auVar22 & auVar143) & auVar151 | auVar16 & auVar137) & auVar146 |
                 auVar10 & auVar130) & auVar140 | auVar155 & auVar127) & auVar148 |
                auVar152 & auVar133;
    auVar134._8_8_ = uStack_dc0;
    auVar134._0_8_ = local_dc8;
    local_e08 = ((((((((((((((auVar157 | auVar126 & auVar81) & auVar138 | auVar128 & auVar75) &
                            auVar141 | auVar131 & auVar69) & auVar144 | auVar135 & auVar63) &
                          auVar158 | auVar150 & auVar61) & auVar156 | auVar142 & auVar52) & auVar147
                       | auVar136 & auVar39) & auVar160 | auVar132 & auVar33) & auVar139 |
                     auVar129 & auVar27) & auVar145 | auVar159 & auVar45) & auVar154 |
                   auVar143 & auVar21) & auVar151 | auVar137 & auVar15) & auVar146 |
                 auVar130 & auVar9) & auVar140 | auVar127 & auVar153) & auVar148 |
                auVar133 & auVar134;
    local_de8 = ((((((((((((((uVar120 | local_750 & uVar88) & uVar123 | local_6d8 & uVar89) &
                            uVar116 | local_660 & uVar90) & uVar121 | local_5e8 & uVar91) & uVar104
                         | local_570 & uVar92) & uVar105 | local_4f8 & uVar93) & uVar106 |
                       local_480 & uVar94) & uVar117 | local_408 & uVar95) & uVar107 |
                     local_390 & uVar96) & uVar124 | local_318 & uVar97) & uVar108 |
                   local_2a0 & uVar98) & uVar122 | local_228 & uVar99) & uVar118 |
                 local_1b0 & uVar100) & uVar109 | local_138 & uVar101) & uVar110 | local_c0 & uVar87
    ;
    local_de0 = ((((((((((((((uVar111 | local_748 & uVar88) & uVar123 | local_6d0 & uVar89) &
                            uVar116 | local_658 & uVar90) & uVar121 | local_5e0 & uVar91) & uVar104
                         | local_568 & uVar92) & uVar105 | local_4f0 & uVar93) & uVar106 |
                       local_478 & uVar94) & uVar117 | local_400 & uVar95) & uVar107 |
                     local_388 & uVar96) & uVar124 | local_310 & uVar97) & uVar108 |
                   local_298 & uVar98) & uVar122 | local_220 & uVar99) & uVar118 |
                 local_1a8 & uVar100) & uVar109 | local_130 & uVar101) & uVar110 | local_b8 & uVar87
    ;
    local_dd8 = uVar110 & (((((uVar124 & ((((((uVar121 & (((uVar119 | local_740 & uVar88) & uVar123
                                                          | local_6c8 & uVar89) & uVar116 |
                                                         local_650 & uVar90) | uVar91 & local_5d8) &
                                              uVar104 | local_560 & uVar92) & uVar105 |
                                            local_4e8 & uVar93) & uVar106 | local_470 & uVar94) &
                                           uVar117 | local_3f8 & uVar95) & uVar107 |
                                         local_380 & uVar96) | uVar97 & local_308) & uVar108 |
                             local_290 & uVar98) & uVar122 | local_218 & uVar99) & uVar118 |
                           local_1a0 & uVar100) & uVar109 | local_128 & uVar101) | uVar87 & local_b0
    ;
    Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)local_e48);
  }
  return;
}

Assistant:

void Hacl_Impl_K256_PointMul_point_mul(uint64_t *out, uint64_t *scalar, uint64_t *q)
{
  uint64_t table[240U] = { 0U };
  uint64_t tmp[15U] = { 0U };
  uint64_t *t0 = table;
  uint64_t *t1 = table + 15U;
  Hacl_Impl_K256_Point_make_point_at_inf(t0);
  memcpy(t1, q, 15U * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * 15U;
    Hacl_Impl_K256_PointDouble_point_double(tmp, t11);
    memcpy(table + (2U * i + 2U) * 15U, tmp, 15U * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * 15U;
    Hacl_Impl_K256_PointAdd_point_add(tmp, q, t2);
    memcpy(table + (2U * i + 3U) * 15U, tmp, 15U * sizeof (uint64_t)););
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  uint64_t tmp0[15U] = { 0U };
  for (uint32_t i0 = 0U; i0 < 64U; i0++)
  {
    KRML_MAYBE_FOR4(i, 0U, 4U, 1U, Hacl_Impl_K256_PointDouble_point_double(out, out););
    uint32_t k = 256U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(4U, scalar, k, 4U);
    memcpy(tmp0, (uint64_t *)table, 15U * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * 15U;
      KRML_MAYBE_FOR15(i,
        0U,
        15U,
        1U,
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp0);
  }
}